

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O2

void __thiscall QEvdevKeyboardManager::addKeyboard(QEvdevKeyboardManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  long *local_50;
  long *local_48;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevKey();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = pQVar1->name;
    local_40[0] = 2;
    local_40[1] = 0;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_40,"Adding keyboard at %ls",uVar2);
  }
  local_48 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  QEvdevKeyboardHandler::create
            ((QEvdevKeyboardHandler *)&local_48,deviceNode,&this->m_spec,&this->m_defaultKeymapFile)
  ;
  if (local_48 == (long *)0x0) {
    local_40[0] = 2;
    local_40[1] = 0;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_28 = "default";
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_40,"Failed to open keyboard device %ls",uVar2);
  }
  else {
    local_50 = local_48;
    local_48 = (long *)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::add
              (&this->m_keyboards,deviceNode,
               (unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>)
               &local_50);
    if (local_50 != (long *)0x0) {
      (**(code **)(*local_50 + 0x20))();
    }
    local_50 = (long *)0x0;
    updateDeviceCount(this);
  }
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardManager::addKeyboard(const QString &deviceNode)
{
    qCDebug(qLcEvdevKey, "Adding keyboard at %ls", qUtf16Printable(deviceNode));
    auto keyboard = QEvdevKeyboardHandler::create(deviceNode, m_spec, m_defaultKeymapFile);
    if (keyboard) {
        m_keyboards.add(deviceNode, std::move(keyboard));
        updateDeviceCount();
    } else {
        qWarning("Failed to open keyboard device %ls", qUtf16Printable(deviceNode));
    }
}